

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigopcount_tests.cpp
# Opt level: O2

ScriptError
sigopcount_tests::VerifyWithFlag(CTransaction *output,CMutableTransaction *input,uint32_t flags)

{
  long lVar1;
  pointer pCVar2;
  bool bVar3;
  BaseSignatureChecker *checker;
  ScriptError *serror;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  check_type cVar4;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  assertion_result local_108;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 local_d0 [16];
  undefined1 *local_c0;
  char **local_b8;
  undefined8 local_b0;
  ScriptError error;
  CTransaction inputi;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CTransaction::CTransaction(&inputi,input);
  pCVar2 = (output->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  checker = (BaseSignatureChecker *)local_d0;
  local_d0._0_8_ = &PTR_CheckECDSASignature_0114ca30;
  local_c0 = (undefined1 *)0x0;
  local_b8 = (char **)pCVar2->nValue;
  local_b0 = 0;
  serror = &error;
  local_d0._8_8_ = &inputi;
  bVar3 = VerifyScript(&(inputi.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start)->scriptSig,&pCVar2->scriptPubKey,
                       &(inputi.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start)->scriptWitness,0x801,checker,serror);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x4d;
  file.m_begin = (iterator)&local_e0;
  msg.m_end = (iterator)serror;
  msg.m_begin = (iterator)checker;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f0,msg);
  local_108.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(bVar3 != (error != SCRIPT_ERR_OK));
  local_108.m_message.px = (element_type *)0x0;
  local_108.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b8 = &local_118;
  local_118 = "(ret == true) == (error == SCRIPT_ERR_OK)";
  local_110 = "";
  local_d0._8_8_ = local_d0._8_8_ & 0xffffffffffffff00;
  local_d0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_120 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_108,(lazy_ostream *)local_d0,1,0,WARN,_cVar4,(size_t)&local_128,0x4d);
  boost::detail::shared_count::~shared_count(&local_108.m_message.pn);
  CTransaction::~CTransaction(&inputi);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return error;
  }
  __stack_chk_fail();
}

Assistant:

static ScriptError VerifyWithFlag(const CTransaction& output, const CMutableTransaction& input, uint32_t flags)
{
    ScriptError error;
    CTransaction inputi(input);
    bool ret = VerifyScript(inputi.vin[0].scriptSig, output.vout[0].scriptPubKey, &inputi.vin[0].scriptWitness, flags, TransactionSignatureChecker(&inputi, 0, output.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &error);
    BOOST_CHECK((ret == true) == (error == SCRIPT_ERR_OK));

    return error;
}